

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

object * gcialloc(int sz)

{
  int sz_00;
  object *poVar1;
  
  sz_00 = (sz + 7) / 8;
  poVar1 = (object *)((long)&memoryPointer->header + (long)(sz_00 * -8 + -0x10));
  memoryPointer = poVar1;
  if ((long)poVar1 < (long)memoryBase) {
    poVar1 = gcollect(sz_00);
  }
  else {
    poVar1->header = (ulong)(uint)(sz_00 << 2);
  }
  poVar1->header = (ulong)(sz * 4 + 2);
  return poVar1;
}

Assistant:

struct object *gcialloc(int sz)
{
    int trueSize;
    struct object *result;

    trueSize = TO_WORDS(sz);
    result = gcalloc(trueSize);
    SET_SIZE(result, sz);
    SET_BINOBJ(result);
    return result;
}